

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O1

void __thiscall
duckdb::DataTable::InitializeLocalStorage
          (DataTable *this,LocalAppendState *state,TableCatalogEntry *table,ClientContext *context,
          vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
          *bound_constraints)

{
  _Head_base<0UL,_duckdb::ConstraintState_*,_false> _Var1;
  DuckTransaction *this_00;
  LocalStorage *this_01;
  _Head_base<0UL,_duckdb::ConstraintState_*,_false> _Var2;
  TransactionException *this_02;
  DataTableInfo *this_03;
  string local_88;
  string local_68;
  string local_48;
  
  if ((this->version)._M_i != MAIN_TABLE) {
    this_02 = (TransactionException *)__cxa_allocate_exception(0x10);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,
               "Transaction conflict: attempting to insert into table \"%s\" but it has been %s by a different transaction"
               ,"");
    this_03 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(&this->info);
    DataTableInfo::GetTableName_abi_cxx11_(&local_48,this_03);
    TableModification_abi_cxx11_(&local_68,this);
    TransactionException::TransactionException<std::__cxx11::string,std::__cxx11::string>
              (this_02,&local_88,&local_48,&local_68);
    __cxa_throw(this_02,&TransactionException::typeinfo,::std::runtime_error::~runtime_error);
  }
  this_00 = DuckTransaction::Get(context,this->db);
  this_01 = DuckTransaction::GetLocalStorage(this_00);
  LocalStorage::InitializeStorage(this_01,state,this);
  _Var2._M_head_impl = (ConstraintState *)operator_new(0x10);
  (_Var2._M_head_impl)->table = table;
  (_Var2._M_head_impl)->bound_constraints = bound_constraints;
  _Var1._M_head_impl =
       (state->constraint_state).
       super_unique_ptr<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ConstraintState_*,_std::default_delete<duckdb::ConstraintState>_>
       .super__Head_base<0UL,_duckdb::ConstraintState_*,_false>._M_head_impl;
  (state->constraint_state).
  super_unique_ptr<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>._M_t.
  super___uniq_ptr_impl<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::ConstraintState_*,_std::default_delete<duckdb::ConstraintState>_>.
  super__Head_base<0UL,_duckdb::ConstraintState_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (_Var1._M_head_impl != (ConstraintState *)0x0) {
    operator_delete(_Var1._M_head_impl);
    return;
  }
  return;
}

Assistant:

void DataTable::InitializeLocalStorage(LocalAppendState &state, TableCatalogEntry &table, ClientContext &context,
                                       const vector<unique_ptr<BoundConstraint>> &bound_constraints) {
	if (!IsMainTable()) {
		throw TransactionException("Transaction conflict: attempting to insert into table \"%s\" but it has been %s by "
		                           "a different transaction",
		                           GetTableName(), TableModification());
	}

	auto &local_storage = LocalStorage::Get(context, db);
	local_storage.InitializeStorage(state, *this);
	state.constraint_state = InitializeConstraintState(table, bound_constraints);
}